

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_6::TwoLevelIterator::~TwoLevelIterator(TwoLevelIterator *this)

{
  long lVar1;
  Iterator *pIVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__TwoLevelIterator_00a1a890;
  std::__cxx11::string::~string((string *)&this->data_block_handle_);
  pIVar2 = (this->data_iter_).iter_;
  if (pIVar2 != (Iterator *)0x0) {
    (*pIVar2->_vptr_Iterator[1])();
  }
  pIVar2 = (this->index_iter_).iter_;
  if (pIVar2 != (Iterator *)0x0) {
    (*pIVar2->_vptr_Iterator[1])();
  }
  Status::~Status(&this->status_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    Iterator::~Iterator(&this->super_Iterator);
    return;
  }
  __stack_chk_fail();
}

Assistant:

TwoLevelIterator::~TwoLevelIterator() = default;